

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void proto2_unittest::TestMutualRecursionA::SharedDtor(MessageLite *self)

{
  TestMutualRecursionB *this;
  MessageLite *self_00;
  ulong uVar1;
  undefined8 extraout_RAX;
  
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
    uVar1 = (self->_internal_metadata_).ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this = (TestMutualRecursionB *)self[3]._vptr_MessageLite;
    if (this != (TestMutualRecursionB *)0x0) {
      TestMutualRecursionB::~TestMutualRecursionB(this);
    }
    operator_delete(this,0x28);
    self_00 = (MessageLite *)self[3]._internal_metadata_.ptr_;
    if (self_00 != (MessageLite *)0x0) {
      TestMutualRecursionA_SubGroup::SharedDtor(self_00);
    }
    operator_delete(self_00,0x28);
    google::protobuf::RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR>::
    ~RepeatedPtrField((RepeatedPtrField<proto2_unittest::TestMutualRecursionA_SubGroupR> *)
                      &self[1]._internal_metadata_);
    return;
  }
  SharedDtor((TestMutualRecursionA *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void TestMutualRecursionA::SharedDtor(MessageLite& self) {
  TestMutualRecursionA& this_ = static_cast<TestMutualRecursionA&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.bb_;
  delete this_._impl_.subgroup_;
  this_._impl_.~Impl_();
}